

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O2

SubControl __thiscall QScrollBarPrivate::newHoverControl(QScrollBarPrivate *this,QPoint *pos)

{
  long lVar1;
  QWidget *this_00;
  SubControl SVar2;
  QStyle *pQVar3;
  long lVar4;
  undefined8 *puVar5;
  QStyleOptionSlider *pQVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QStyleOptionSlider opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar5 = &DAT_00661ce0;
  pQVar6 = &opt;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pQVar6 = *puVar5;
    puVar5 = puVar5 + 1;
    pQVar6 = (QStyleOptionSlider *)((long)pQVar6 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&opt);
  opt.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0xffffffff;
  pQVar3 = QWidget::style(this_00);
  SVar2 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,2,&opt,pos,this_00);
  this->hoverControl = SVar2;
  if (SVar2 == SC_None) {
    (this->hoverRect).x1 = 0;
    (this->hoverRect).y1 = 0;
    (this->hoverRect).x2 = -1;
    (this->hoverRect).y2 = -1;
    SVar2 = SC_None;
  }
  else {
    pQVar3 = QWidget::style(this_00);
    QVar7 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,2,&opt,this->hoverControl,this_00);
    this->hoverRect = QVar7;
    SVar2 = this->hoverControl;
  }
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QScrollBarPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QScrollBar);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, pos, q);
    if (hoverControl == QStyle::SC_None)
        hoverRect = QRect();
    else
        hoverRect = q->style()->subControlRect(QStyle::CC_ScrollBar, &opt, hoverControl, q);
    return hoverControl;
}